

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::JsonMappingApi::DecodeRawTransaction(string *request_message)

{
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  *in_RSI;
  string *in_RDI;
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  *in_stack_00000190;
  string *in_stack_00000198;
  
  std::
  function<void(cfd::api::json::DecodeRawTransactionRequest*,cfd::api::json::DecodeRawTransactionResponse*)>
  ::
  function<void(&)(cfd::api::json::DecodeRawTransactionRequest*,cfd::api::json::DecodeRawTransactionResponse*),void>
            (in_RSI,(_func_void_DecodeRawTransactionRequest_ptr_DecodeRawTransactionResponse_ptr *)
                    in_RDI);
  ExecuteDirectApi<cfd::api::json::DecodeRawTransactionRequest,cfd::api::json::DecodeRawTransactionResponse>
            (in_stack_00000198,in_stack_00000190);
  std::
  function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
  ::~function((function<void_(cfd::api::json::DecodeRawTransactionRequest_*,_cfd::api::json::DecodeRawTransactionResponse_*)>
               *)0x63f51b);
  return in_RDI;
}

Assistant:

std::string JsonMappingApi::DecodeRawTransaction(
    const std::string &request_message) {
  return ExecuteDirectApi<
      DecodeRawTransactionRequest,
      DecodeRawTransactionResponse>(
      request_message, TransactionJsonApi::DecodeRawTransaction);
}